

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Helpers.cpp
# Opt level: O3

void Helpers::WriteOutputPNG
               (string *path,vector<unsigned_int,_std::allocator<unsigned_int>_> *data,uint width,
               uint bufferHeight,double gamma,double colorScale)

{
  pointer puVar1;
  double dVar2;
  undefined1 auVar3 [16];
  uchar uVar4;
  uint uVar5;
  int iVar6;
  pointer puVar7;
  FILE *__stream;
  png_structp ppVar8;
  __jmp_buf_tag *__env;
  long lVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  ulong __n;
  png_structp png_ptr;
  png_infop info_ptr;
  uint local_ac;
  uint local_a8;
  uint local_a4;
  vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> rows;
  vector<unsigned_char,_std::allocator<unsigned_char>_> pngData;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&pngData,(ulong)(width * bufferHeight * 6),(allocator_type *)&rows);
  __n = (ulong)(bufferHeight * 2);
  std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::vector
            (&rows,__n,(allocator_type *)&png_ptr);
  iVar6 = width * 3;
  if (__n != 0) {
    uVar5 = 0;
    uVar11 = 0;
    do {
      rows.super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>._M_impl.
      super__Vector_impl_data._M_start[uVar11] =
           pngData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start + uVar5;
      uVar11 = uVar11 + 1;
      uVar5 = uVar5 + iVar6;
    } while (__n != uVar11);
  }
  puVar7 = (data->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar1 = (data->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  lVar9 = (long)puVar1 - (long)puVar7;
  local_a8 = bufferHeight;
  local_a4 = width;
  if (lVar9 != 0) {
    uVar11 = lVar9 >> 2;
    uVar5 = 1;
    uVar12 = 0;
    do {
      uVar13 = puVar7[uVar12];
      if (puVar7[uVar12] < uVar5) {
        uVar13 = uVar5;
      }
      uVar5 = uVar13;
      uVar12 = uVar12 + 1;
    } while ((uVar12 & 0xffffffff) < uVar11);
    if (puVar1 != puVar7) {
      local_ac = uVar5 >> 1;
      auVar3._8_8_ = -(ulong)(0.0001 < ABS(gamma + -1.0));
      auVar3._0_8_ = -(ulong)(0.0001 < ABS(colorScale + -1.0));
      iVar10 = movmskpd(uVar5,auVar3);
      uVar13 = 1;
      uVar12 = 0;
      do {
        if (iVar10 == 0) {
          uVar4 = (uchar)((puVar7[uVar12] * 0xff + local_ac) / uVar5);
        }
        else {
          dVar2 = ((double)puVar7[uVar12] * colorScale) / (double)uVar5;
          if (1.0 <= dVar2) {
            dVar2 = 1.0;
          }
          dVar2 = pow(dVar2,gamma);
          uVar4 = (uchar)(int)(dVar2 * 255.0);
          uVar11 = (long)(data->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)(data->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                         _M_impl.super__Vector_impl_data._M_start >> 2;
        }
        pngData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start[uVar12 + uVar11] = uVar4;
        uVar12 = (ulong)uVar13;
        puVar7 = (data->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        uVar11 = (long)(data->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                       _M_impl.super__Vector_impl_data._M_finish - (long)puVar7 >> 2;
        uVar13 = uVar13 + 1;
      } while (uVar12 < uVar11);
    }
  }
  uVar5 = local_a4;
  if (local_a8 != 0) {
    uVar11 = 0;
    do {
      if (local_a4 != 0) {
        uVar12 = 0;
        do {
          rows.super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>._M_impl.
          super__Vector_impl_data._M_start[uVar11][uVar12] =
               rows.super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>._M_impl.
               super__Vector_impl_data._M_start[~(uint)uVar11 + bufferHeight * 2][uVar12];
          uVar12 = uVar12 + 1;
        } while (iVar6 + (uint)(iVar6 == 0) != uVar12);
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 != local_a8);
  }
  __stream = fopen((path->_M_dataplus)._M_p,"wb");
  if (__stream == (FILE *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Failed to open image.png for writing.",0x25);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'P');
    std::ostream::put('P');
    std::ostream::flush();
  }
  else {
    ppVar8 = (png_structp)png_create_write_struct("1.6.37",0,0);
    png_ptr = ppVar8;
    if (ppVar8 != (png_structp)0x0) {
      info_ptr = (png_infop)png_create_info_struct(ppVar8);
      if (info_ptr == (png_infop)0x0) {
        png_destroy_write_struct(&png_ptr,0);
      }
      else {
        __env = (__jmp_buf_tag *)png_set_longjmp_fn(ppVar8,longjmp,200);
        iVar6 = _setjmp(__env);
        if (iVar6 == 0) {
          png_init_io(png_ptr,__stream);
          png_set_IHDR(png_ptr,info_ptr,uVar5,__n,8,2,0,0,0);
          png_write_info(png_ptr,info_ptr);
          png_write_image(png_ptr,rows.
                                  super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          png_write_end(png_ptr,info_ptr);
        }
        png_destroy_write_struct(&png_ptr,&info_ptr);
      }
    }
    fclose(__stream);
  }
  if (rows.super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(rows.super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)rows.super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)rows.super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (pngData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(pngData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)pngData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)pngData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void WriteOutputPNG(const std::string &path, const std::vector<uint32_t>& data, unsigned int width, unsigned int bufferHeight, double gamma, double colorScale)
    {
        std::vector<png_byte> pngData(3*width*2*bufferHeight);
        std::vector<png_byte *> rows{2*bufferHeight};
        for(unsigned int i = 0; i < 2*bufferHeight ; ++i)
        {
            rows[i] = pngData.data()+3*width*i;
        }

        uint32_t maxValue{UINT32_C(1)};
        for(unsigned int i = 0; i < data.size();++i)
        {
            maxValue = std::max(maxValue,data[i]);
        }
        for(unsigned int i = 0; i < data.size();++i)
        {
            if(fabs(gamma - 1.0) > 0.0001 || fabs(colorScale - 1.0) > 0.0001)
            {
                pngData[data.size() + i] = static_cast<png_byte>(255.0 * pow(std::min(1.0,colorScale*static_cast<double>(data[i])/static_cast<double>(maxValue)),gamma));
            }
            else
            {
                pngData[data.size() + i] = (255*data[i] + (maxValue/2))/maxValue;
            }
        }
        for(unsigned int i = 0; i < bufferHeight;++i)
        {
            for(unsigned int j = 0; j < width*3;++j)
            {
                rows[i][j] =rows[2*bufferHeight-i-1][j];
            }
        }

        ScopedCFileDescriptor fd(path.c_str(), "wb");
        if(!fd.IsValid())
        {
            std::cerr << "Failed to open image.png for writing." << std::endl;
            return;
        }
        png_structp png_ptr = png_create_write_struct(PNG_LIBPNG_VER_STRING, nullptr, nullptr, nullptr);
        if(!png_ptr)
        {
            return;
        }
        png_infop info_ptr = png_create_info_struct(png_ptr);
        if(!info_ptr)
        {
            png_destroy_write_struct(&png_ptr, (png_infopp)NULL);
            return;
        }
        if(setjmp(png_jmpbuf(png_ptr)))
        {
            png_destroy_write_struct(&png_ptr, &info_ptr);
            return;
        }
        png_init_io(png_ptr, fd.Get());
        png_set_IHDR(png_ptr, info_ptr, width, 2*bufferHeight, 8, PNG_COLOR_TYPE_RGB, PNG_INTERLACE_NONE, PNG_COMPRESSION_TYPE_DEFAULT, PNG_FILTER_TYPE_DEFAULT);

        png_write_info(png_ptr, info_ptr);
        //header written.

        png_write_image(png_ptr, rows.data());

        png_write_end(png_ptr, info_ptr);
        png_destroy_write_struct(&png_ptr, &info_ptr);
    }